

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int WebRtcIsac_DecodeUb16
              (TransformTables *transform_tables,float *signal_out,ISACUBDecStruct *ISACdecUB_obj,
              int16_t isRCUPayload)

{
  float *stateF;
  int16_t iVar1;
  int iVar2;
  long lVar3;
  float *stateG;
  double percepFilterParam [65];
  double imag_f [240];
  double real_f [240];
  double halfFrameSecond [240];
  double halfFrameFirst [240];
  double adStack_2048 [5];
  double local_2020 [30];
  double local_1f30 [31];
  double local_1e38 [720];
  double local_7b8 [241];
  
  memset(adStack_2048,0,0x208);
  iVar1 = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,adStack_2048,0x10);
  if (iVar1 < 0) {
    iVar2 = (int)iVar1;
  }
  else {
    iVar2 = WebRtcIsac_DecodeSpec
                      (&ISACdecUB_obj->bitstr_obj,0,kIsacUpperBand16,local_1e38 + 0xf0,local_1e38);
    if (-1 < iVar2) {
      if (isRCUPayload != 0) {
        lVar3 = 0;
        do {
          local_1e38[lVar3 + 0xf0] = local_1e38[lVar3 + 0xf0] + local_1e38[lVar3 + 0xf0];
          local_1e38[lVar3 + 0xf1] = local_1e38[lVar3 + 0xf1] + local_1e38[lVar3 + 0xf1];
          local_1e38[lVar3] = local_1e38[lVar3] + local_1e38[lVar3];
          local_1e38[lVar3 + 1] = local_1e38[lVar3 + 1] + local_1e38[lVar3 + 1];
          lVar3 = lVar3 + 2;
        } while (lVar3 != 0xf0);
      }
      WebRtcIsac_Spec2time
                (transform_tables,local_1e38 + 0xf0,local_1e38,local_7b8,local_1e38 + 0x1e0,
                 &ISACdecUB_obj->fftstr_obj);
      stateF = (ISACdecUB_obj->maskfiltstr_obj).PostStateLoF;
      stateG = (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG;
      WebRtcIsac_NormLatticeFilterAr(4,stateF,stateG,local_7b8,local_2020,signal_out);
      WebRtcIsac_NormLatticeFilterAr
                (4,stateF,stateG,local_1e38 + 0x1e0,local_1f30,signal_out + 0xf0);
    }
  }
  return iVar2;
}

Assistant:

int WebRtcIsac_DecodeUb16(const TransformTables* transform_tables,
                          float* signal_out, ISACUBDecStruct* ISACdecUB_obj,
                          int16_t isRCUPayload) {
  int len, err;

  double halfFrameFirst[FRAMESAMPLES_HALF];
  double halfFrameSecond[FRAMESAMPLES_HALF];

  double percepFilterParam[(UB_LPC_ORDER + 1) * (SUBFRAMES << 1) +
                           (UB_LPC_ORDER + 1)];

  double real_f[FRAMESAMPLES_HALF];
  double imag_f[FRAMESAMPLES_HALF];
  const int16_t kAveragePitchGain = 0; /* No pitch-gain for upper-band. */
  len = 0;

  /* Decode & de-quantize filter coefficients. */
  memset(percepFilterParam, 0, sizeof(percepFilterParam));
  err = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,
                                       percepFilterParam, isac16kHz);
  if (err < 0) {
    return err;
  }

  /* Decode & de-quantize spectrum. */
  len = WebRtcIsac_DecodeSpec(&ISACdecUB_obj->bitstr_obj, kAveragePitchGain,
                              kIsacUpperBand16, real_f, imag_f);
  if (len < 0) {
    return len;
  }
  if (isRCUPayload) {
    int n;
    for (n = 0; n < 240; n++) {
      real_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
      imag_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
    }
  }
  /* Inverse transform. */
  WebRtcIsac_Spec2time(transform_tables,
                       real_f, imag_f, halfFrameFirst, halfFrameSecond,
                       &ISACdecUB_obj->fftstr_obj);

  /* Perceptual post-filtering (using normalized lattice filter). */
  WebRtcIsac_NormLatticeFilterAr(
      UB_LPC_ORDER, ISACdecUB_obj->maskfiltstr_obj.PostStateLoF,
      (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG, halfFrameFirst,
      &percepFilterParam[(UB_LPC_ORDER + 1)], signal_out);

  WebRtcIsac_NormLatticeFilterAr(
      UB_LPC_ORDER, ISACdecUB_obj->maskfiltstr_obj.PostStateLoF,
      (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG, halfFrameSecond,
      &percepFilterParam[(UB_LPC_ORDER + 1) * SUBFRAMES + (UB_LPC_ORDER + 1)],
      &signal_out[FRAMESAMPLES_HALF]);

  return len;
}